

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcwidth.c
# Opt level: O2

int mk_wcswidth(uint *pwcs,size_t n)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = 0;
  iVar2 = 0;
  while( true ) {
    if (pwcs[sVar3] == 0) {
      return iVar2;
    }
    if (n == sVar3) break;
    iVar1 = mk_wcwidth(pwcs[sVar3]);
    if (iVar1 < 0) {
      return -1;
    }
    iVar2 = iVar2 + iVar1;
    sVar3 = sVar3 + 1;
  }
  return iVar2;
}

Assistant:

int mk_wcswidth(const unsigned int *pwcs, size_t n)
{
  int w, width = 0;

  for (;*pwcs && n-- > 0; pwcs++)
    if ((w = mk_wcwidth(*pwcs)) < 0)
      return -1;
    else
      width += w;

  return width;
}